

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

size_t __thiscall
jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytesWithExtraItem
          (SDES *this,uint8_t itemdatalength)

{
  _List_node_base *p_Var1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  _Self __tmp;
  _List_node_base *p_Var5;
  
  p_Var5 = (this->sdessources).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 == (_List_node_base *)&this->sdessources) {
    sVar3 = 0;
  }
  else {
    lVar4 = 0;
    for (; p_Var1 = (this->sdesit)._M_node, p_Var5 != p_Var1; p_Var5 = p_Var5->_M_next) {
      sVar3 = SDESSource::NeededBytes((SDESSource *)p_Var5[1]._M_next);
      lVar4 = lVar4 + sVar3;
    }
    sVar3 = SDESSource::NeededBytesWithExtraItem((SDESSource *)p_Var1[1]._M_next,itemdatalength);
    uVar2 = (this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size;
    sVar3 = sVar3 + lVar4 + ((uVar2 / 0x1f + 1) - (ulong)(uVar2 % 0x1f == 0)) * 4;
  }
  return sVar3;
}

Assistant:

size_t NeededBytesWithExtraItem(uint8_t itemdatalength)
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdesit ; it++)
				x += (*it)->NeededBytes();
			x += (*sdesit)->NeededBytesWithExtraItem(itemdatalength);
			n = sdessources.size();
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}